

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::addAndRenameFormFields
          (QPDFAcroFormDocumentHelper *this,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *fields)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDFObjectHandle *this_01;
  bool bVar1;
  string *key;
  size_type sVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  QPDFObjectHandle local_410;
  QPDFFormFieldObjectHelper local_400;
  reference local_3c8;
  QPDFObjectHandle *i;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  string local_3a0 [32];
  QPDFObjectHandle local_380;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  QPDFObjectHandle local_330;
  allocator<char> local_319;
  string local_318;
  undefined1 local_2f8 [8];
  string append;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> local_278;
  undefined1 local_248 [8];
  string append_1;
  undefined1 local_220 [4];
  int suffix;
  string new_name;
  QPDFFormFieldObjectHelper local_1f0;
  undefined1 local_1b8 [8];
  string old_name;
  string local_190;
  reference local_170;
  T *kid;
  iterator __end4;
  iterator __begin4;
  QPDFArrayItems *__range4;
  string local_f8 [32];
  undefined1 local_d8 [8];
  QPDFObjectHandle kids;
  value_type *obj;
  allocator<QPDFObjectHandle> local_a1;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_a0;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_98;
  undefined1 local_90 [8];
  list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  set seen;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  renames;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *fields_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  analyze(this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
            _M_impl.super__Rb_tree_header._M_node_count);
  QPDFObjGen::set::set
            ((set *)&queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                     _M_impl._M_node._M_size);
  local_98._M_current =
       (QPDFObjectHandle *)
       std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(fields);
  local_a0._M_current =
       (QPDFObjectHandle *)
       std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(fields);
  std::allocator<QPDFObjectHandle>::allocator(&local_a1);
  std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
  list<__gnu_cxx::__normal_iterator<QPDFObjectHandle*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>,void>
            ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)local_90,local_98,local_a0,
             &local_a1);
  std::allocator<QPDFObjectHandle>::~allocator(&local_a1);
  while (bVar1 = std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty
                           ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_90),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    key = (string *)
          std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::front
                    ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_90);
    kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)key);
    bVar1 = QPDFObjGen::set::add
                      ((set *)&queue.
                               super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl._M_node._M_size,
                       (QPDFObjGen)
                       kids.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f8,"/Kids",(allocator<char> *)((long)&__range4 + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d8,key);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
      bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_d8);
      if (bVar1) {
        QPDFObjectHandle::aitems
                  ((QPDFObjectHandle *)
                   &__begin4.ivalue.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        this_00 = &__begin4.ivalue.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        QPDFObjectHandle::QPDFArrayItems::begin
                  ((iterator *)
                   &__end4.ivalue.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (QPDFArrayItems *)this_00);
        QPDFObjectHandle::QPDFArrayItems::end((iterator *)&kid,(QPDFArrayItems *)this_00);
        while (bVar1 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                                 ((iterator *)
                                  &__end4.ivalue.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount,(iterator *)&kid), bVar1) {
          local_170 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*
                                ((iterator *)
                                 &__end4.ivalue.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_90,local_170
                    );
          QPDFObjectHandle::QPDFArrayItems::iterator::operator++
                    ((iterator *)
                     &__end4.ivalue.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&kid);
        QPDFObjectHandle::QPDFArrayItems::iterator::~iterator
                  ((iterator *)
                   &__end4.ivalue.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::QPDFArrayItems::~QPDFArrayItems
                  ((QPDFArrayItems *)
                   &__begin4.ivalue.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"/T",(allocator<char> *)(old_name.field_2._M_local_buf + 0xf))
      ;
      bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)key,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)(old_name.field_2._M_local_buf + 0xf));
      if (bVar1) {
        this_01 = (QPDFObjectHandle *)((long)&new_name.field_2 + 8);
        QPDFObjectHandle::QPDFObjectHandle(this_01,(QPDFObjectHandle *)key);
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_1f0,this_01);
        QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_((string *)local_1b8,&local_1f0);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_1f0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&new_name.field_2 + 8));
        sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&seen.
                            super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                            ._M_t._M_impl.super__Rb_tree_header._M_node_count,(key_type *)local_1b8)
        ;
        if (sVar2 == 0) {
          std::__cxx11::string::string((string *)local_220,(string *)local_1b8);
          append_1.field_2._12_4_ = 0;
          std::__cxx11::string::string((string *)local_248);
          while( true ) {
            getFieldsWithQualifiedName(&local_278,this,(string *)local_220);
            bVar1 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::empty
                              (&local_278);
            std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set
                      (&local_278);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            append_1.field_2._12_4_ = append_1.field_2._12_4_ + 1;
            std::__cxx11::to_string(&local_2b8,append_1.field_2._12_4_);
            std::operator+(&local_298,"+",&local_2b8);
            std::__cxx11::string::operator=((string *)local_248,(string *)&local_298);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&append.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_248);
            std::__cxx11::string::operator=
                      ((string *)local_220,(string *)(append.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(append.field_2._M_local_buf + 8));
          }
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&seen.
                                    super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                    ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)local_1b8);
          std::__cxx11::string::operator=((string *)pmVar3,(string *)local_248);
          std::__cxx11::string::~string((string *)local_248);
          std::__cxx11::string::~string((string *)local_220);
        }
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&seen.
                                  super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                  ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)local_1b8);
        std::__cxx11::string::string((string *)local_2f8,(string *)pmVar3);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"/T",&local_319);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_3a0,"/T",(allocator<char> *)((long)&__range1 + 7));
          QPDFObjectHandle::getKey(&local_380,key);
          QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_370,&local_380);
          std::operator+(&local_350,&local_370,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8);
          QPDFObjectHandle::newUnicodeString(&local_330,&local_350);
          QPDFObjectHandle::replaceKey((QPDFObjectHandle *)key,&local_318,&local_330);
          QPDFObjectHandle::~QPDFObjectHandle(&local_330);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_370);
          QPDFObjectHandle::~QPDFObjectHandle(&local_380);
          std::__cxx11::string::~string(local_3a0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
          std::__cxx11::string::~string((string *)&local_318);
          std::allocator<char>::~allocator(&local_319);
        }
        std::__cxx11::string::~string((string *)local_2f8);
        std::__cxx11::string::~string((string *)local_1b8);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
    }
    std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::pop_front
              ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_90);
  }
  std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~list
            ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_90);
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(fields);
  i = (QPDFObjectHandle *)
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(fields);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                     *)&i), bVar1) {
    local_3c8 = __gnu_cxx::
                __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                ::operator*(&__end1);
    QPDFObjectHandle::QPDFObjectHandle(&local_410,local_3c8);
    QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_400,&local_410);
    addFormField(this,&local_400);
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_400);
    QPDFObjectHandle::~QPDFObjectHandle(&local_410);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  QPDFObjGen::set::~set
            ((set *)&queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                     _M_impl._M_node._M_size);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
             _M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::addAndRenameFormFields(std::vector<QPDFObjectHandle> fields)
{
    analyze();
    std::map<std::string, std::string> renames;
    QPDFObjGen::set seen;
    for (std::list<QPDFObjectHandle> queue{fields.begin(), fields.end()}; !queue.empty();
         queue.pop_front()) {
        auto& obj = queue.front();
        if (seen.add(obj)) {
            auto kids = obj.getKey("/Kids");
            if (kids.isArray()) {
                for (auto const& kid: kids.aitems()) {
                    queue.push_back(kid);
                }
            }

            if (obj.hasKey("/T")) {
                // Find something we can append to the partial name that makes the fully qualified
                // name unique. When we find something, reuse the same suffix for all fields in this
                // group with the same name. We can only change the name of fields that have /T, and
                // this field's /T is always at the end of the fully qualified name, appending to /T
                // has the effect of appending the same thing to the fully qualified name.
                std::string old_name = QPDFFormFieldObjectHelper(obj).getFullyQualifiedName();
                if (renames.count(old_name) == 0) {
                    std::string new_name = old_name;
                    int suffix = 0;
                    std::string append;
                    while (!getFieldsWithQualifiedName(new_name).empty()) {
                        ++suffix;
                        append = "+" + std::to_string(suffix);
                        new_name = old_name + append;
                    }
                    renames[old_name] = append;
                }
                std::string append = renames[old_name];
                if (!append.empty()) {
                    obj.replaceKey(
                        "/T",
                        QPDFObjectHandle::newUnicodeString(
                            obj.getKey("/T").getUTF8Value() + append));
                }
            }
        }
    }

    for (auto const& i: fields) {
        addFormField(i);
    }
}